

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitterByCenter.hpp
# Opt level: O0

void __thiscall
NBvh3::SplitterByCenter<NBvh3::KDop<16U>_>::split
          (SplitterByCenter<NBvh3::KDop<16U>_> *this,TVertices *left,TVertices *right)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint local_24;
  uint i;
  TVertices *right_local;
  TVertices *left_local;
  SplitterByCenter<NBvh3::KDop<16U>_> *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>::size(this->mVertices);
    if (sVar2 <= local_24) break;
    pvVar3 = std::vector<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>::operator[]
                       (this->mVertices,(ulong)local_24);
    bVar1 = isRight(this,pvVar3);
    if (bVar1) {
      pvVar3 = std::vector<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>::operator[]
                         (this->mVertices,(ulong)local_24);
      std::vector<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>::push_back(right,pvVar3);
    }
    else {
      pvVar3 = std::vector<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>::operator[]
                         (this->mVertices,(ulong)local_24);
      std::vector<NBvh3::SVertex,_std::allocator<NBvh3::SVertex>_>::push_back(left,pvVar3);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void SplitterByCenter<TBv>::split(TVertices& left, TVertices& right) const
{
    for (unsigned i = 0; i < mVertices.size(); ++i)
    {
        if (isRight(mVertices[i]))
        {
            right.push_back(mVertices[i]);
        }
        else
        {
            left.push_back(mVertices[i]);
        }
    }
}